

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
CP::priority_queue<int,_std::less<int>_>::fixUp
          (priority_queue<int,_std::less<int>_> *this,size_t idx)

{
  bool bVar1;
  ulong uVar2;
  size_t p;
  size_t sStack_18;
  int tmp;
  size_t idx_local;
  priority_queue<int,_std::less<int>_> *this_local;
  
  p._4_4_ = this->mData[idx];
  sStack_18 = idx;
  idx_local = (size_t)this;
  while (sStack_18 != 0) {
    uVar2 = sStack_18 - 1 >> 1;
    bVar1 = std::less<int>::operator()
                      ((less<int> *)&this->field_0x18,(int *)((long)&p + 4),this->mData + uVar2);
    if (bVar1) break;
    this->mData[sStack_18] = this->mData[uVar2];
    sStack_18 = uVar2;
  }
  this->mData[sStack_18] = p._4_4_;
  return;
}

Assistant:

void fixUp(size_t idx) {
      T tmp = mData[idx];
      while (idx > 0) {
        size_t p = (idx - 1) / 2;
        if ( mLess(tmp,mData[p]) ) break;
        mData[idx] = mData[p];
        idx = p;
      }
      mData[idx] = tmp;
    }